

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_0::HandleEdgeCase<float>
               (ParsedFloat *input,bool negative,Nonnull<float_*> value)

{
  long *plVar1;
  float fVar2;
  float fVar3;
  float local_d8;
  float local_d4;
  char *nan_argument;
  long local_c0;
  ptrdiff_t nan_size;
  char n_char_sequence [128];
  ptrdiff_t kNanBufferSize;
  Nonnull<float_*> value_local;
  bool negative_local;
  ParsedFloat *input_local;
  
  if (input->type == kNan) {
    if (input->subrange_begin == (char *)0x0) {
      nan_size._0_1_ = 0;
    }
    else {
      local_c0 = (long)input->subrange_end - (long)input->subrange_begin;
      nan_argument = (char *)0x7f;
      plVar1 = std::min<long>(&local_c0,(long *)&nan_argument);
      local_c0 = *plVar1;
      std::copy_n<char_const*,long,char*>(input->subrange_begin,local_c0,(char *)&nan_size);
      n_char_sequence[local_c0 + -8] = '\0';
    }
    if (negative) {
      local_d4 = FloatTraits<float>::MakeNan((Nonnull<const_char_*>)&nan_size);
      local_d4 = -local_d4;
    }
    else {
      local_d4 = FloatTraits<float>::MakeNan((Nonnull<const_char_*>)&nan_size);
    }
    *value = local_d4;
    input_local._7_1_ = true;
  }
  else if (input->type == kInfinity) {
    fVar2 = std::numeric_limits<float>::infinity();
    fVar3 = std::numeric_limits<float>::infinity();
    local_d8 = -fVar2;
    if (!negative) {
      local_d8 = fVar3;
    }
    *value = local_d8;
    input_local._7_1_ = true;
  }
  else if (input->mantissa == 0) {
    fVar2 = -0.0;
    if (!negative) {
      fVar2 = 0.0;
    }
    *value = fVar2;
    input_local._7_1_ = true;
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

bool HandleEdgeCase(const strings_internal::ParsedFloat& input, bool negative,
                    absl::Nonnull<FloatType*> value) {
  if (input.type == strings_internal::FloatType::kNan) {
    // A bug in gcc would cause the compiler to optimize away the buffer we are
    // building below.  Declaring the buffer volatile avoids the issue, and has
    // no measurable performance impact in microbenchmarks.
    //
    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=86113
    constexpr ptrdiff_t kNanBufferSize = 128;
#if (defined(__GNUC__) && !defined(__clang__))
    volatile char n_char_sequence[kNanBufferSize];
#else
    char n_char_sequence[kNanBufferSize];
#endif
    if (input.subrange_begin == nullptr) {
      n_char_sequence[0] = '\0';
    } else {
      ptrdiff_t nan_size = input.subrange_end - input.subrange_begin;
      nan_size = std::min(nan_size, kNanBufferSize - 1);
      std::copy_n(input.subrange_begin, nan_size, n_char_sequence);
      n_char_sequence[nan_size] = '\0';
    }
    char* nan_argument = const_cast<char*>(n_char_sequence);
    *value = negative ? -FloatTraits<FloatType>::MakeNan(nan_argument)
                      : FloatTraits<FloatType>::MakeNan(nan_argument);
    return true;
  }
  if (input.type == strings_internal::FloatType::kInfinity) {
    *value = negative ? -std::numeric_limits<FloatType>::infinity()
                      : std::numeric_limits<FloatType>::infinity();
    return true;
  }
  if (input.mantissa == 0) {
    *value = negative ? -0.0 : 0.0;
    return true;
  }
  return false;
}